

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MruDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
::MruListEntry::MruListEntry(MruListEntry *this,RegexKey *key,RegexPattern **value)

{
  RegexPattern **value_local;
  RegexKey *key_local;
  MruListEntry *this_local;
  
  DoublyLinkedListElement<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruListEntry,_Memory::Recycler>
  ::DoublyLinkedListElement
            (&this->
              super_DoublyLinkedListElement<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruListEntry,_Memory::Recycler>
            );
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierPtr(&this->value,*value);
  UnifiedRegex::RegexKey::RegexKey(&this->key,key);
  this->dictionaryDataIndex = 0;
  return;
}

Assistant:

MruListEntry(const TKey &key, const TValue &value) : key(key), value(value), dictionaryDataIndex(0)
            {
            }